

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

void Curl_unencode_cleanup(connectdata *conn)

{
  Curl_easy *pCVar1;
  contenc_writer *pcVar2;
  
  pCVar1 = conn->data;
  pcVar2 = (pCVar1->req).writer_stack;
  while (pcVar2 != (contenc_writer *)0x0) {
    (pCVar1->req).writer_stack = pcVar2->downstream;
    (*pcVar2->handler->close_writer)(conn,pcVar2);
    (*Curl_cfree)(pcVar2);
    pcVar2 = (pCVar1->req).writer_stack;
  }
  return;
}

Assistant:

void Curl_unencode_cleanup(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;
  contenc_writer *writer = k->writer_stack;

  while(writer) {
    k->writer_stack = writer->downstream;
    writer->handler->close_writer(conn, writer);
    free(writer);
    writer = k->writer_stack;
  }
}